

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

int container_rank(container_t *c,uint8_t type,uint16_t x)

{
  uint8_t local_19;
  uint16_t x_local;
  array_container_t *paStack_18;
  uint8_t type_local;
  container_t *c_local;
  
  local_19 = type;
  paStack_18 = (array_container_t *)c;
  paStack_18 = (array_container_t *)container_unwrap_shared(c,&local_19);
  if (local_19 == '\x01') {
    c_local._4_4_ = bitset_container_rank((bitset_container_t *)paStack_18,x);
  }
  else if (local_19 == '\x02') {
    c_local._4_4_ = array_container_rank(paStack_18,x);
  }
  else {
    if (local_19 != '\x03') {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                    ,0x18ee,"int container_rank(const container_t *, uint8_t, uint16_t)");
    }
    c_local._4_4_ = run_container_rank((run_container_t *)paStack_18,x);
  }
  return c_local._4_4_;
}

Assistant:

static inline int container_rank(
    const container_t *c, uint8_t type,
    uint16_t x
){
    c = container_unwrap_shared(c, &type);
    switch (type) {
        case BITSET_CONTAINER_TYPE:
            return bitset_container_rank(const_CAST_bitset(c), x);
        case ARRAY_CONTAINER_TYPE:
            return array_container_rank(const_CAST_array(c), x);
        case RUN_CONTAINER_TYPE:
            return run_container_rank(const_CAST_run(c), x);
        default:
            assert(false);
            __builtin_unreachable();
    }
    assert(false);
    __builtin_unreachable();
    return false;
}